

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_nop_statement_t *stmt)

{
  vector<long,_std::allocator<long>_> *this_00;
  iterator __position;
  invalid_argument *this_01;
  long local_18;
  
  if ((stmt->super_typed_statement_t)._type != STMT_TYPE_BAD) {
    local_18 = 0x1d;
    this_00 = (this->_bytecode_back_inserter).container;
    __position._M_current =
         (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (this_00,__position,&local_18);
    }
    else {
      *__position._M_current = 0x1d;
      (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"invalid statement");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void visit(tchecker::typed_nop_statement_t const & stmt)
  {
    if (stmt.type() == tchecker::STMT_TYPE_BAD)
      throw std::invalid_argument("invalid statement");

    // Write bytecode
    _bytecode_back_inserter = tchecker::VM_NOP;
  }